

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

bool Js::AssertBooleanProperty(DynamicObject *state,PropertyIds propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptBoolean *pJVar4;
  Var local_18;
  Var propertyValue;
  
  local_18 = (Var)0x0;
  JavascriptOperators::GetProperty
            (&state->super_RecyclableObject,propertyId._value,&local_18,
             (((((state->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,(PropertyValueInfo *)0x0);
  if (local_18 != (Var)0x0) {
    bVar2 = VarIs<Js::JavascriptBoolean>(local_18);
    if (bVar2) goto LAB_00b5afd8;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0x174,"(propertyValue && VarIs<T>(propertyValue))",
                              "propertyValue && VarIs<T>(propertyValue)");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b5afd8:
  pJVar4 = UnsafeVarTo<Js::JavascriptBoolean>(local_18);
  return pJVar4->value != 0;
}

Assistant:

static bool AssertBooleanProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        return AssertProperty<JavascriptBoolean>(state, propertyId)->GetValue();
    }